

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
compute_averages(vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 *allresults)

{
  size_type sVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  size_t z_1;
  size_t z;
  size_t k;
  vector<double,_std::allocator<double>_> *answer;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  sVar1 = std::
          vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
          ::size(in_RSI);
  if (sVar1 == 0) {
    memset(in_RDI,0,0x18);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x17ecb7);
  }
  else {
    pvVar2 = std::
             vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             ::operator[](in_RSI,0);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(pvVar2);
    std::allocator<double>::allocator((allocator<double> *)0x17ecf1);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<double>::~allocator((allocator<double> *)0x17ed14);
    local_30 = 0;
    while (sVar1 = local_30,
          sVar3 = std::
                  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                  ::size(in_RSI), sVar1 < sVar3) {
      local_38 = 0;
      while( true ) {
        sVar1 = local_38;
        sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
        auVar7 = in_ZMM0._0_16_;
        if (sVar3 <= sVar1) break;
        pvVar2 = std::
                 vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ::operator[](in_RSI,local_30);
        pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (pvVar2,local_38);
        auVar7 = vcvtusi2sd_avx512f(auVar7,*pvVar4);
        dVar6 = auVar7._0_8_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_38);
        in_ZMM0 = ZEXT864((ulong)(dVar6 + *pvVar5));
        *pvVar5 = dVar6 + *pvVar5;
        local_38 = local_38 + 1;
      }
      local_30 = local_30 + 1;
    }
    local_40 = 0;
    while( true ) {
      auVar7 = in_ZMM0._0_16_;
      sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
      if (sVar1 <= local_40) break;
      sVar1 = std::
              vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              ::size(in_RSI);
      auVar7 = vcvtusi2sd_avx512f(auVar7,sVar1);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_40);
      dVar6 = *pvVar5 / auVar7._0_8_;
      in_ZMM0 = ZEXT864((ulong)dVar6);
      *pvVar5 = dVar6;
      local_40 = local_40 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<double>
compute_averages(std::vector< std::vector<unsigned long long> > allresults) {
    if (allresults.size() == 0)
        return std::vector<double>();
    
    std::vector<double> answer(allresults[0].size());
    
    for (size_t k = 0; k < allresults.size(); k++) {
        assert(allresults[k].size() == answer.size());
        for (size_t z = 0; z < answer.size(); z++) {
            answer[z] += allresults[k][z];
        }
    }

    for (size_t z = 0; z < answer.size(); z++) {
        answer[z] /= allresults.size();
    }
    return answer;
}